

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_connection(Curl_easy *data,curl_socket_t *sfd,connectdata **connp)

{
  curl_socket_t cVar1;
  connectdata **connp_local;
  curl_socket_t *sfd_local;
  Curl_easy *data_local;
  
  if (data == (Curl_easy *)0x0) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if ((*(ulong *)&(data->set).field_0x910 >> 0x25 & 1) == 0) {
    Curl_failf(data,"CONNECT_ONLY is required!");
    data_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    cVar1 = Curl_getconnectinfo(data,connp);
    *sfd = cVar1;
    if (*sfd == -1) {
      Curl_failf(data,"Failed to get recent socket");
      data_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode easy_connection(struct Curl_easy *data,
                                curl_socket_t *sfd,
                                struct connectdata **connp)
{
  if(data == NULL)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* only allow these to be called on handles with CURLOPT_CONNECT_ONLY */
  if(!data->set.connect_only) {
    failf(data, "CONNECT_ONLY is required!");
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  *sfd = Curl_getconnectinfo(data, connp);

  if(*sfd == CURL_SOCKET_BAD) {
    failf(data, "Failed to get recent socket");
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  return CURLE_OK;
}